

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::MapFieldBase::InsertOrLookupMapValueNoSync
          (MapFieldBase *this,MapKey *map_key,MapValueRef *val)

{
  UntypedMapBase *this_00;
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  uint32_t uVar4;
  NodeBase *node;
  bool *pbVar5;
  double *pdVar6;
  float *pfVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  MessageLite *msg;
  uint *puVar9;
  uint64_t uVar10;
  unsigned_long *puVar11;
  string_view local_40;
  
  bVar1 = LookupMapValueNoSync(this,map_key,&val->super_MapValueConstRef);
  if (bVar1) goto LAB_0024410f;
  this_00 = (UntypedMapBase *)(this + 1);
  node = UntypedMapBase::AllocNode
                   (this_00,(ulong)*(ushort *)
                                    ((long)&this[1].super_MapFieldBaseForParse.prototype_as_void_ +
                                    4));
  switch(*(byte *)((long)&this[1].super_MapFieldBaseForParse.prototype_as_void_ + 7) >> 4) {
  case 0:
    pbVar5 = UntypedMapBase::GetValue<bool>(this_00,node);
    *pbVar5 = false;
    break;
  case 1:
    pfVar7 = (float *)UntypedMapBase::GetValue<unsigned_int>(this_00,node);
    goto LAB_00243fe7;
  case 2:
    pdVar6 = (double *)UntypedMapBase::GetValue<unsigned_long>(this_00,node);
    goto LAB_00243fc6;
  case 3:
    pfVar7 = UntypedMapBase::GetValue<float>(this_00,node);
LAB_00243fe7:
    *pfVar7 = 0.0;
    break;
  case 4:
    pdVar6 = UntypedMapBase::GetValue<double>(this_00,node);
LAB_00243fc6:
    *pdVar6 = 0.0;
    break;
  case 5:
    pbVar8 = UntypedMapBase::GetValue<std::__cxx11::string>(this_00,node);
    InitializeKeyValue<std::__cxx11::string>(this,pbVar8);
    break;
  case 6:
    msg = UntypedMapBase::GetValue<google::protobuf::MessageLite>(this_00,node);
    InitializeKeyValue(this,msg);
    break;
  default:
    goto switchD_00243f9c_default;
  }
  (val->super_MapValueConstRef).data_ =
       (void *)((long)&node->next +
               (ulong)*(byte *)((long)&this[1].super_MapFieldBaseForParse.prototype_as_void_ + 6));
  CVar3 = MapKey::type(map_key);
  switch(CVar3) {
  case CPPTYPE_INT32:
    uVar4 = MapKey::GetInt32Value(map_key);
    break;
  case CPPTYPE_INT64:
    uVar10 = MapKey::GetInt64Value(map_key);
    goto LAB_002440f3;
  case CPPTYPE_UINT32:
    uVar4 = MapKey::GetUInt32Value(map_key);
    break;
  case CPPTYPE_UINT64:
    uVar10 = MapKey::GetUInt64Value(map_key);
LAB_002440f3:
    puVar11 = UntypedMapBase::GetKey<unsigned_long>(this_00,node);
    *puVar11 = uVar10;
    KeyMapBase<unsigned_long>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_long> *)this_00,(KeyNode *)node);
    goto LAB_0024410f;
  default:
    InsertOrLookupMapValueNoSync();
switchD_00243f9c_default:
    InsertOrLookupMapValueNoSync();
  case CPPTYPE_BOOL:
    bVar2 = MapKey::GetBoolValue(map_key);
    pbVar5 = UntypedMapBase::GetKey<bool>(this_00,node);
    *pbVar5 = bVar2;
    KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)this_00,(KeyNode *)node);
    goto LAB_0024410f;
  case CPPTYPE_STRING:
    local_40 = MapKey::GetStringValue(map_key);
    pbVar8 = UntypedMapBase::GetKey<std::__cxx11::string>(this_00,node);
    InitializeKeyValue<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
              (this,pbVar8,&local_40);
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertOrReplaceNode((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00,(KeyNode *)node);
    goto LAB_0024410f;
  }
  puVar9 = UntypedMapBase::GetKey<unsigned_int>(this_00,node);
  *puVar9 = uVar4;
  KeyMapBase<unsigned_int>::InsertOrReplaceNode((KeyMapBase<unsigned_int> *)this_00,(KeyNode *)node)
  ;
LAB_0024410f:
  return !bVar1;
}

Assistant:

bool MapFieldBase::InsertOrLookupMapValueNoSync(const MapKey& map_key,
                                                MapValueRef* val) {
  if (LookupMapValueNoSync(map_key, static_cast<MapValueConstRef*>(val))) {
    return false;
  }

  auto& map = GetMapRaw();

  NodeBase* node = map.AllocNode();
  map.VisitValue(node, [&](auto* v) { InitializeKeyValue(v); });
  val->SetValue(map.GetVoidValue(node));

  return VisitMapKey(map_key, map, [&](auto& map, const auto& key) {
    InitializeKeyValue(map.GetKey(node), key);
    map.InsertOrReplaceNode(
        static_cast<typename std::decay_t<decltype(map)>::KeyNode*>(node));
    return true;
  });
}